

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,true,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t *piVar7;
  ulong uVar8;
  uint uVar9;
  ValidityMask *mask_00;
  undefined1 uVar10;
  undefined7 in_register_00000089;
  ValidityMask *pVVar11;
  ValidityMask *pVVar12;
  interval_t iVar13;
  interval_t left;
  interval_t left_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar7 = &result_data->micros;
    uVar10 = fun;
    for (pVVar11 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar11;
        pVVar11 = (ValidityMask *)
                  ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1))
    {
      uVar3 = ldata->months;
      iVar13.micros = (int64_t)mask;
      iVar13._0_8_ = ldata->micros;
      iVar13 = BinaryZeroIsNullWrapper::
               Operation<bool,duckdb::DivideOperator,duckdb::interval_t,double,duckdb::interval_t>
                         ((BinaryZeroIsNullWrapper *)(ulong)fun,SUB41(uVar3,0),iVar13,
                          rdata[(long)pVVar11],pVVar11,CONCAT71(in_register_00000089,uVar10));
      ((interval_t *)(piVar7 + -1))->months = (int)iVar13._0_8_;
      ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar13._0_8_ >> 0x20);
      *piVar7 = iVar13.micros;
      piVar7 = piVar7 + 2;
    }
  }
  else {
    uVar9 = (uint)fun;
    pVVar11 = (ValidityMask *)0x0;
    for (uVar6 = 0; uVar6 != count + 0x3f >> 6; uVar6 = uVar6 + 1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        pVVar12 = pVVar11 + 2;
        if (count <= pVVar11 + 2) {
          pVVar12 = (ValidityMask *)count;
        }
LAB_0151087f:
        piVar7 = &result_data[(long)pVVar11].micros;
        for (; mask_00 = pVVar11, pVVar11 < pVVar12;
            pVVar11 = (ValidityMask *)
                      ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      1)) {
          uVar1 = ldata->months;
          left.micros = (int64_t)mask;
          left._0_8_ = ldata->micros;
          iVar13 = BinaryZeroIsNullWrapper::
                   Operation<bool,duckdb::DivideOperator,duckdb::interval_t,double,duckdb::interval_t>
                             ((BinaryZeroIsNullWrapper *)(ulong)uVar9,SUB41(uVar1,0),left,
                              rdata[(long)pVVar11],pVVar11,CONCAT71(in_register_00000089,fun));
          ((interval_t *)(piVar7 + -1))->months = (int)iVar13._0_8_;
          ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar13._0_8_ >> 0x20);
          *piVar7 = iVar13.micros;
          piVar7 = piVar7 + 2;
        }
      }
      else {
        uVar5 = puVar4[uVar6];
        pVVar12 = pVVar11 + 2;
        if (count <= pVVar11 + 2) {
          pVVar12 = (ValidityMask *)count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_0151087f;
        mask_00 = pVVar12;
        if (uVar5 != 0) {
          piVar7 = &result_data[(long)pVVar11].micros;
          for (uVar8 = 0;
              mask_00 = (ValidityMask *)
                        ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + uVar8), mask_00 < pVVar12; uVar8 = uVar8 + 1) {
            if ((uVar5 >> (uVar8 & 0x3f) & 1) != 0) {
              uVar2 = ldata->months;
              left_00.micros = (int64_t)mask;
              left_00._0_8_ = ldata->micros;
              iVar13 = BinaryZeroIsNullWrapper::
                       Operation<bool,duckdb::DivideOperator,duckdb::interval_t,double,duckdb::interval_t>
                                 ((BinaryZeroIsNullWrapper *)(ulong)uVar9,SUB41(uVar2,0),left_00,
                                  rdata[(long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>)
                                               .validity_mask + uVar8],mask_00,
                                  CONCAT71(in_register_00000089,fun));
              ((interval_t *)(piVar7 + -1))->months = (int)iVar13._0_8_;
              ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar13._0_8_ >> 0x20);
              *piVar7 = iVar13.micros;
            }
            piVar7 = piVar7 + 2;
          }
        }
      }
      pVVar11 = mask_00;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}